

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_I.c
# Opt level: O0

void test_I(void)

{
  wchar_t wVar1;
  char *pcVar2;
  int r;
  char *envstr;
  char *reffile;
  
  pcVar2 = setlocale(6,"en_US.UTF-8");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_I.c"
                   ,L'\x1b');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    extract_reference_file("test_I.zip");
    wVar1 = systemf("%s %s -I UTF-8 %s >test.out 2>test.err",
                    "env LANG=en_US.UTF-8 LC_ALL=en_US.UTF-8 LC_CTYPE=en_US.UTF-8",testprog,
                    "test_I.zip");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_I.c"
                        ,L'%',0,"0",(long)wVar1,"r",(void *)0x0);
    assertion_non_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_I.c"
               ,L'&',"test.out");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_I.c"
               ,L'\'',"test.err");
    assertion_text_file_contents
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/unzip/test/test_I.c"
               ,L')',"Hello, World!\n",anon_var_dwarf_5246);
  }
  return;
}

Assistant:

DEFINE_TEST(test_I)
{
	const char *reffile = "test_I.zip";
#if !defined(_WIN32) || defined(__CYGWIN__)
	const char *envstr = "env LANG=en_US.UTF-8 LC_ALL=en_US.UTF-8 "
	    "LC_CTYPE=en_US.UTF-8";
#else
	const char *envstr = "";
#endif
	int r;

#if HAVE_SETLOCALE
	if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
		skipping("en_US.UTF-8 locale not available on this system.");
		return;
	}
#else
	skipping("setlocale() not available on this system.");
#endif

	extract_reference_file(reffile);
	r = systemf("%s %s -I UTF-8 %s >test.out 2>test.err", envstr, testprog,
	    reffile);
	assertEqualInt(0, r);
	assertNonEmptyFile("test.out");
	assertEmptyFile("test.err");

	assertTextFileContents("Hello, World!\n", "Γειά σου Κόσμε.txt");
}